

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineno.cpp
# Opt level: O1

int __thiscall Lineno::getNextChar(Lineno *this,char *buffer,int maxBuffer)

{
  bool bVar1;
  
  if (((this->line_)._M_string_length <= this->pos_) && (bVar1 = getNextLine(this), !bVar1)) {
    return 0;
  }
  *buffer = (this->line_)._M_dataplus._M_p[this->pos_];
  this->pos_ = this->pos_ + 1;
  return (uint)(*buffer != '\0');
}

Assistant:

int  Lineno::getNextChar(char* buffer, int maxBuffer) {
    const int FAIL    = 0;
    const int SUCCESS = 1;

    // if at the line's end, then try to get the next line
    if ( pos_ >= line_.size() ) {
        if ( ! getNextLine() ) {
            return FAIL;
        }
    }

    // read the next character
    buffer[0] = line_[pos_];
    ++pos_;

    // assert that the character we get is not 0('\0');
    return (buffer[0] == 0) ? FAIL : SUCCESS;
}